

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall
CEditor::DoButton_Image
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip,
          bool Used)

{
  int iVar1;
  char *pText_00;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float fVar2;
  float fVar3;
  vec4 vVar4;
  vec4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  vVar4 = GetButtonColor(this,pID,Checked);
  local_48 = vVar4;
  if (!Used) {
    local_48.field_1.y = vVar4.field_1.y * 0.5;
    local_48.field_0.x = vVar4.field_0.x * 0.5;
    local_48.field_3 = vVar4.field_3;
    local_48.field_2.z = vVar4.field_2.z * 0.5;
  }
  fVar3 = pRect->w;
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (0x41200000,this->m_pTextRender,pText,0xffffffffffffffff);
  fVar2 = (fVar3 * 8.0) / extraout_XMM0_Da;
  fVar3 = 10.0;
  if (fVar2 <= 10.0) {
    fVar3 = fVar2;
  }
  CUIRect::Draw(pRect,&local_48,3.0,0xf);
  iVar1 = 5;
  CUI::DoLabel(&this->m_UI,pRect,pText,
               (float)(-(uint)(fVar2 < 6.0) & 0x40c00000 | ~-(uint)(fVar2 < 6.0) & (uint)fVar3),5,
               -1.0,true);
  iVar1 = DoButton_Editor_Common(this,pID,pText_00,iVar1,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_Image(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip, bool Used)
{
	// darken the button if not used
	vec4 ButtonColor = GetButtonColor(pID, Checked);
	if(!Used)
		ButtonColor *= vec4(0.5f, 0.5f, 0.5f, 1.0f);

	const float FontSize = clamp(8.0f * pRect->w / TextRender()->TextWidth(10.0f, pText, -1), 6.0f, 10.0f);
	pRect->Draw(ButtonColor, 3.0f);
	UI()->DoLabel(pRect, pText, FontSize, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}